

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexEmitterShader::VertexEmitterShader
          (VertexEmitterShader *this,ContextType *contextType,int emitCountA,int endCountA,
          int emitCountB,int endCountB,GeometryShaderOutputType outputType)

{
  ShaderProgramDeclaration *pSVar1;
  string local_320;
  GeometrySource local_300;
  GeometryShaderDeclaration local_2e0;
  allocator<char> local_2c1;
  string local_2c0;
  string local_2a0;
  FragmentSource local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  VertexSource local_218;
  FragmentOutput local_1f8;
  GeometryToFragmentVarying local_1f4;
  VertexToGeometryVarying local_1ec;
  allocator<char> local_1e1;
  string local_1e0;
  VertexAttribute local_1c0;
  allocator<char> local_181;
  string local_180;
  VertexAttribute local_160;
  ShaderProgramDeclaration local_138;
  int local_28;
  int local_24;
  int endCountB_local;
  int emitCountB_local;
  int endCountA_local;
  int emitCountA_local;
  ContextType *contextType_local;
  VertexEmitterShader *this_local;
  
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032bdc98;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032bdcd0;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032bdce8;
  local_28 = endCountB;
  local_24 = emitCountB;
  endCountB_local = endCountA;
  emitCountB_local = emitCountA;
  _endCountA_local = contextType;
  contextType_local = (ContextType *)this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"a_position",&local_181);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_160,&local_180,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_138,&local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"a_color",&local_1e1);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1c0,&local_1e0,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1c0);
  sglr::pdec::VertexToGeometryVarying::VertexToGeometryVarying(&local_1ec,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1ec);
  sglr::pdec::GeometryToFragmentVarying::GeometryToFragmentVarying
            (&local_1f4,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1f4);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_1f8,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_geom_FragColor;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n\tv_geom_FragColor = a_color;\n}\n"
             ,&local_259);
  specializeShader(&local_238,&local_258,_endCountA_local);
  sglr::pdec::VertexSource::VertexSource(&local_218,&local_238);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
             ,&local_2c1);
  specializeShader(&local_2a0,&local_2c0,_endCountA_local);
  sglr::pdec::FragmentSource::FragmentSource(&local_280,&local_2a0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_280);
  sglr::pdec::GeometryShaderDeclaration::GeometryShaderDeclaration
            (&local_2e0,GEOMETRYSHADERINPUTTYPE_POINTS,outputType,
             (long)(emitCountB_local + local_24),1);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2e0);
  Functional::(anonymous_namespace)::VertexEmitterShader::genGeometrySource_abi_cxx11_
            (&local_320,(VertexEmitterShader *)this,_endCountA_local,emitCountB_local,
             endCountB_local,local_24,local_28,outputType);
  sglr::pdec::GeometrySource::GeometrySource(&local_300,&local_320);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_300);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  sglr::pdec::GeometrySource::~GeometrySource(&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  sglr::pdec::FragmentSource::~FragmentSource(&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  sglr::pdec::VertexSource::~VertexSource(&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_138);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032bdc98;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032bdcd0;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032bdce8;
  *(int *)&(this->super_ShaderProgram).field_0x154 = emitCountB_local;
  this->m_endCountA = endCountB_local;
  this->m_emitCountB = local_24;
  this->m_endCountB = local_28;
  return;
}

Assistant:

VertexEmitterShader::VertexEmitterShader (const glu::ContextType& contextType, int emitCountA, int endCountA, int emitCountB, int endCountB, rr::GeometryShaderOutputType outputType)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_color", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToGeometryVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::GeometryToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource(specializeShader(s_commonShaderSourceVertex, contextType))
							<< sglr::pdec::FragmentSource(specializeShader(s_commonShaderSourceFragment, contextType))
							<< sglr::pdec::GeometryShaderDeclaration(rr::GEOMETRYSHADERINPUTTYPE_POINTS, outputType, emitCountA + emitCountB)
							<< sglr::pdec::GeometrySource(genGeometrySource(contextType, emitCountA, endCountA, emitCountB, endCountB, outputType)))
	, m_emitCountA		(emitCountA)
	, m_endCountA		(endCountA)
	, m_emitCountB		(emitCountB)
	, m_endCountB		(endCountB)
{
}